

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

int32_t __thiscall
icu_63::MessagePattern::parsePluralOrSelectStyle
          (MessagePattern *this,UMessagePatternArgType argType,int32_t index,int32_t nestingLevel,
          UParseError *parseError,UErrorCode *errorCode)

{
  char16_t *pcVar1;
  short sVar2;
  bool bVar3;
  int8_t iVar4;
  uint uVar5;
  uint uVar6;
  int32_t limit;
  int iVar7;
  uint uVar8;
  int iVar9;
  char16_t *pcVar10;
  uint uVar11;
  UErrorCode UVar12;
  bool bVar13;
  bool bVar14;
  bool local_7a;
  
  uVar5 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar5 = skipWhiteSpace(this,index);
    sVar2 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
    uVar6 = (uint)sVar2;
    if (sVar2 < 0) {
      uVar8 = (this->msg).fUnion.fFields.fLength;
    }
    else {
      uVar8 = (int)uVar6 >> 5;
    }
    local_7a = true;
    if (uVar5 == uVar8) {
      bVar3 = true;
      bVar13 = true;
    }
    else {
      pcVar1 = (char16_t *)((long)&(this->msg).fUnion + 2);
      bVar14 = false;
      bVar3 = false;
      do {
        if (uVar5 < uVar8) {
          pcVar10 = pcVar1;
          if ((uVar6 & 2) == 0) {
            pcVar10 = (this->msg).fUnion.fFields.fArray;
          }
          if (pcVar10[(int)uVar5] == L'}') {
            bVar13 = false;
            break;
          }
        }
        if (((argType == UMSGPAT_ARG_TYPE_SELECTORDINAL) || (argType == UMSGPAT_ARG_TYPE_PLURAL)) &&
           (uVar5 < uVar8)) {
          pcVar10 = pcVar1;
          if ((uVar6 & 2) == 0) {
            pcVar10 = (this->msg).fUnion.fFields.fArray;
          }
          if (pcVar10[(int)uVar5] != L'=') goto LAB_00288ce6;
          limit = skipDouble(this,uVar5 + 1);
          iVar9 = limit - uVar5;
          if (iVar9 == 1) {
            UVar12 = U_PATTERN_SYNTAX_ERROR;
            uVar6 = index;
            goto LAB_00288ef9;
          }
          if (0xffff < iVar9) {
            UVar12 = U_INDEX_OUTOFBOUNDS_ERROR;
            uVar6 = uVar5;
            goto LAB_00288ef9;
          }
          addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,uVar5,iVar9,0,errorCode);
          parseDouble(this,uVar5 + 1,limit,'\0',parseError,errorCode);
LAB_00288db5:
          if (U_ZERO_ERROR < *errorCode) {
            return 0;
          }
          uVar8 = skipWhiteSpace(this,limit);
          sVar2 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            uVar11 = (this->msg).fUnion.fFields.fLength;
          }
          else {
            uVar11 = (int)sVar2 >> 5;
          }
          UVar12 = U_PATTERN_SYNTAX_ERROR;
          uVar6 = uVar5;
          if (uVar11 <= uVar8) goto LAB_00288ef9;
          pcVar10 = pcVar1;
          if (((int)sVar2 & 2U) == 0) {
            pcVar10 = (this->msg).fUnion.fFields.fArray;
          }
          if (pcVar10[(int)uVar8] != L'{') goto LAB_00288ef9;
          uVar5 = parseMessage(this,uVar8,1,nestingLevel + 1,argType,parseError,errorCode);
          UVar12 = *errorCode;
        }
        else {
LAB_00288ce6:
          limit = skipIdentifier(this,uVar5);
          UVar12 = U_PATTERN_SYNTAX_ERROR;
          iVar9 = limit - uVar5;
          uVar6 = index;
          if (iVar9 == 0) goto LAB_00288ef9;
          if (iVar9 != 6 || (argType - UMSGPAT_ARG_TYPE_PLURAL & 0xfffffffd) != 0) {
            if (iVar9 < 0x10000) {
LAB_00288d62:
              addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,uVar5,iVar9,0,errorCode);
              iVar4 = UnicodeString::doCompare(&this->msg,uVar5,iVar9,(UChar *)kOther,0,5);
              if (iVar4 == '\0') {
                bVar3 = true;
              }
              goto LAB_00288db5;
            }
            UVar12 = U_INDEX_OUTOFBOUNDS_ERROR;
            uVar6 = uVar5;
            goto LAB_00288ef9;
          }
          sVar2 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar7 = (this->msg).fUnion.fFields.fLength;
          }
          else {
            iVar7 = (int)sVar2 >> 5;
          }
          if ((iVar7 <= limit) ||
             (iVar4 = UnicodeString::doCompare(&this->msg,uVar5,7,(UChar *)kOffsetColon,0,7),
             iVar4 != '\0')) goto LAB_00288d62;
          if (bVar14) goto LAB_00288ef9;
          uVar8 = skipWhiteSpace(this,limit + 1);
          uVar5 = skipDouble(this,uVar8);
          if (uVar5 == uVar8) goto LAB_00288ef9;
          if (0xffff < (int)(uVar5 - uVar8)) {
            UVar12 = U_INDEX_OUTOFBOUNDS_ERROR;
            uVar6 = uVar8;
            goto LAB_00288ef9;
          }
          parseDouble(this,uVar8,uVar5,'\0',parseError,errorCode);
          UVar12 = *errorCode;
        }
        if (U_ZERO_ERROR < UVar12) {
          return 0;
        }
        uVar5 = skipWhiteSpace(this,uVar5);
        sVar2 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
        uVar6 = (uint)sVar2;
        if (sVar2 < 0) {
          uVar8 = (this->msg).fUnion.fFields.fLength;
        }
        else {
          uVar8 = (int)uVar6 >> 5;
        }
        bVar14 = true;
        bVar13 = true;
      } while (uVar5 != uVar8);
      bVar3 = !bVar3;
    }
    if (nestingLevel < 1) {
      local_7a = ((this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.
                 ptr)->type == UMSGPAT_PART_TYPE_MSG_START;
    }
    bVar14 = local_7a == bVar13;
    uVar6 = 0;
    if (bVar14) {
      uVar6 = index;
    }
    if ((bool)(bVar14 | bVar3)) {
      UVar12 = (uint)!bVar14 * 8 + U_PATTERN_SYNTAX_ERROR;
LAB_00288ef9:
      setParseError(this,parseError,uVar6);
      *errorCode = UVar12;
      uVar5 = 0;
    }
  }
  return uVar5;
}

Assistant:

int32_t
MessagePattern::parsePluralOrSelectStyle(UMessagePatternArgType argType,
                                         int32_t index, int32_t nestingLevel,
                                         UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    UBool isEmpty=TRUE;
    UBool hasOther=FALSE;
    for(;;) {
        // First, collect the selector looking for a small set of terminators.
        // It would be a little faster to consider the syntax of each possible
        // token right here, but that makes the code too complicated.
        index=skipWhiteSpace(index);
        UBool eos=index==msg.length();
        if(eos || msg.charAt(index)==u_rightCurlyBrace) {
            if(eos==inMessageFormatPattern(nestingLevel)) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            if(!hasOther) {
                setParseError(parseError, 0);  // Missing 'other' keyword in plural/select pattern.
                errorCode=U_DEFAULT_KEYWORD_MISSING;
                return 0;
            }
            return index;
        }
        int32_t selectorIndex=index;
        if(UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(argType) && msg.charAt(selectorIndex)==u_equal) {
            // explicit-value plural selector: =double
            index=skipDouble(index+1);
            int32_t length=index-selectorIndex;
            if(length==1) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            if(length>Part::MAX_LENGTH) {
                setParseError(parseError, selectorIndex);  // Argument selector too long.
                errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, selectorIndex, length, 0, errorCode);
            parseDouble(selectorIndex+1, index, FALSE,
                        parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
        } else {
            index=skipIdentifier(index);
            int32_t length=index-selectorIndex;
            if(length==0) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            // Note: The ':' in "offset:" is just beyond the skipIdentifier() range.
            if( UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(argType) && length==6 && index<msg.length() &&
                0==msg.compare(selectorIndex, 7, kOffsetColon, 0, 7)
            ) {
                // plural offset, not a selector
                if(!isEmpty) {
                    // Plural argument 'offset:' (if present) must precede key-message pairs.
                    setParseError(parseError, start);
                    errorCode=U_PATTERN_SYNTAX_ERROR;
                    return 0;
                }
                // allow whitespace between offset: and its value
                int32_t valueIndex=skipWhiteSpace(index+1);  // The ':' is at index.
                index=skipDouble(valueIndex);
                if(index==valueIndex) {
                    setParseError(parseError, start);  // Missing value for plural 'offset:'.
                    errorCode=U_PATTERN_SYNTAX_ERROR;
                    return 0;
                }
                if((index-valueIndex)>Part::MAX_LENGTH) {
                    setParseError(parseError, valueIndex);  // Plural offset value too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                parseDouble(valueIndex, index, FALSE,
                            parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
                if(U_FAILURE(errorCode)) {
                    return 0;
                }
                isEmpty=FALSE;
                continue;  // no message fragment after the offset
            } else {
                // normal selector word
                if(length>Part::MAX_LENGTH) {
                    setParseError(parseError, selectorIndex);  // Argument selector too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, selectorIndex, length, 0, errorCode);
                if(0==msg.compare(selectorIndex, length, kOther, 0, 5)) {
                    hasOther=TRUE;
                }
            }
        }
        if(U_FAILURE(errorCode)) {
            return 0;
        }

        // parse the message fragment following the selector
        index=skipWhiteSpace(index);
        if(index==msg.length() || msg.charAt(index)!=u_leftCurlyBrace) {
            setParseError(parseError, selectorIndex);  // No message fragment after plural/select selector.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        index=parseMessage(index, 1, nestingLevel+1, argType, parseError, errorCode);
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        isEmpty=FALSE;
    }
}